

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BondTypesSectionParser.cpp
# Opt level: O3

void __thiscall
OpenMD::BondTypesSectionParser::parseLine
          (BondTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  int iVar1;
  BondType *bondType;
  BondTypeParser btParser;
  string remainder;
  string at2;
  string at1;
  StringTokenizer tokenizer;
  undefined1 local_110 [48];
  string local_e0;
  string local_c0;
  string local_a0;
  StringTokenizer local_80;
  
  local_110._0_8_ = local_110 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110," ;\t\n\r","");
  StringTokenizer::StringTokenizer(&local_80,line,(string *)local_110);
  if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
    operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
  }
  BondTypeParser::BondTypeParser((BondTypeParser *)local_110);
  iVar1 = StringTokenizer::countTokens(&local_80);
  if (iVar1 < 4) {
    snprintf(painCave.errMsg,2000,"BondTypesSectionParser Error: Not enough tokens at line %d\n",
             (ulong)(uint)lineNo);
    painCave.isFatal = 1;
    simError();
  }
  StringTokenizer::nextToken_abi_cxx11_(&local_a0,&local_80);
  StringTokenizer::nextToken_abi_cxx11_(&local_c0,&local_80);
  StringTokenizer::getRemainingString_abi_cxx11_(&local_e0,&local_80);
  bondType = BondTypeParser::parseLine
                       ((BondTypeParser *)local_110,&local_e0,
                        (this->options_->BondForceConstantScaling).data_);
  if (bondType != (BondType *)0x0) {
    ForceField::addBondType(ff,&local_a0,&local_c0,bondType);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BondTypeParser::BondTypeEnum>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BondTypeParser::BondTypeEnum>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BondTypeParser::BondTypeEnum>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BondTypeParser::BondTypeEnum>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BondTypeParser::BondTypeEnum>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BondTypeParser::BondTypeEnum>_>_>
               *)local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.delim_._M_dataplus._M_p != &local_80.delim_.field_2) {
    operator_delete(local_80.delim_._M_dataplus._M_p,
                    local_80.delim_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.tokenString_._M_dataplus._M_p != &local_80.tokenString_.field_2) {
    operator_delete(local_80.tokenString_._M_dataplus._M_p,
                    local_80.tokenString_.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void BondTypesSectionParser::parseLine(ForceField& ff,
                                         const std::string& line, int lineNo) {
    StringTokenizer tokenizer(line);
    BondTypeParser btParser;
    BondType* bondType = NULL;
    int nTokens        = tokenizer.countTokens();

    if (nTokens < 4) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "BondTypesSectionParser Error: Not enough tokens at line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();
    }

    std::string at1       = tokenizer.nextToken();
    std::string at2       = tokenizer.nextToken();
    std::string remainder = tokenizer.getRemainingString();
    RealType kScale       = options_.getBondForceConstantScaling();

    try {
      bondType = btParser.parseLine(remainder, kScale);
    } catch (OpenMDException& e) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "BondTypesSectionParser Error: %s "
               "at line %d\n",
               e.what(), lineNo);
      painCave.isFatal = 1;
      simError();
    }

    if (bondType != NULL) { ff.addBondType(at1, at2, bondType); }
  }